

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::redisplay_range(Fl_Text_Display *this,int startpos,int endpos)

{
  int iVar1;
  int endpos_local;
  int startpos_local;
  Fl_Text_Display *this_local;
  
  if ((this->damage_range1_start == -1) && (this->damage_range1_end == -1)) {
    this->damage_range1_start = startpos;
    this->damage_range1_end = endpos;
  }
  else if (((startpos < this->damage_range1_start) || (this->damage_range1_end < startpos)) &&
          ((endpos < this->damage_range1_start || (this->damage_range1_end < endpos)))) {
    if ((this->damage_range2_start == -1) && (this->damage_range2_end == -1)) {
      this->damage_range2_start = startpos;
      this->damage_range2_end = endpos;
    }
    else {
      iVar1 = min(this->damage_range2_start,startpos);
      this->damage_range2_start = iVar1;
      iVar1 = max(this->damage_range2_end,endpos);
      this->damage_range2_end = iVar1;
    }
  }
  else {
    iVar1 = min(this->damage_range1_start,startpos);
    this->damage_range1_start = iVar1;
    iVar1 = max(this->damage_range1_end,endpos);
    this->damage_range1_end = iVar1;
  }
  Fl_Widget::damage((Fl_Widget *)this,'\x04');
  return;
}

Assistant:

void Fl_Text_Display::redisplay_range(int startpos, int endpos) {
  IS_UTF8_ALIGNED2(buffer(), startpos)
  IS_UTF8_ALIGNED2(buffer(), endpos)

  if (damage_range1_start == -1 && damage_range1_end == -1) {
    damage_range1_start = startpos;
    damage_range1_end = endpos;
  } else if ((startpos >= damage_range1_start && startpos <= damage_range1_end) ||
             (endpos >= damage_range1_start && endpos <= damage_range1_end)) {
    damage_range1_start = min(damage_range1_start, startpos);
    damage_range1_end = max(damage_range1_end, endpos);
  } else if (damage_range2_start == -1 && damage_range2_end == -1) {
    damage_range2_start = startpos;
    damage_range2_end = endpos;
  } else {
    damage_range2_start = min(damage_range2_start, startpos);
    damage_range2_end = max(damage_range2_end, endpos);
  }
  damage(FL_DAMAGE_SCROLL);
}